

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O3

string * __thiscall
flatbuffers::ts::TsGenerator::GenTypeName
          (string *__return_storage_ptr__,TsGenerator *this,import_set *imports,Definition *owner,
          Type *type,bool input,bool allowNull)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  BaseType BVar2;
  string *extraout_RAX;
  long *plVar3;
  string *extraout_RAX_00;
  string *psVar4;
  string *extraout_RAX_01;
  string *extraout_RAX_02;
  char *pcVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  char *pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  undefined3 in_register_00000089;
  string name_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  ImportDefinition local_f8;
  
  BVar2 = type->base_type;
  if (CONCAT31(in_register_00000089,input) == 0) {
    switch(BVar2) {
    case BASE_TYPE_LONG:
    case BASE_TYPE_ULONG:
      goto switchD_0024b2a6_caseD_9;
    case BASE_TYPE_FLOAT:
    case BASE_TYPE_DOUBLE:
    case BASE_TYPE_VECTOR:
    case BASE_TYPE_UNION:
      goto switchD_0024b2a6_caseD_b;
    case BASE_TYPE_STRING:
    case BASE_TYPE_STRUCT:
      local_158 = &local_148;
      local_150 = 0;
      local_148._M_allocated_capacity = local_148._M_allocated_capacity & 0xffffffffffffff00;
      if (BVar2 == BASE_TYPE_STRING) {
        std::__cxx11::string::_M_replace((ulong)&local_158,0,(char *)0x0,0x36efcf);
      }
      else {
        AddImport<flatbuffers::StructDef>(&local_f8,this,imports,owner,type->struct_def);
        std::__cxx11::string::operator=((string *)&local_158,(string *)&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.object_name._M_dataplus._M_p != &local_f8.object_name.field_2) {
          operator_delete(local_f8.object_name._M_dataplus._M_p,
                          local_f8.object_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.rel_file_path._M_dataplus._M_p != &local_f8.rel_file_path.field_2) {
          operator_delete(local_f8.rel_file_path._M_dataplus._M_p,
                          local_f8.rel_file_path.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.bare_file_path._M_dataplus._M_p != &local_f8.bare_file_path.field_2) {
          operator_delete(local_f8.bare_file_path._M_dataplus._M_p,
                          local_f8.bare_file_path.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.export_statement._M_dataplus._M_p != &local_f8.export_statement.field_2) {
          operator_delete(local_f8.export_statement._M_dataplus._M_p,
                          local_f8.export_statement.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.import_statement._M_dataplus._M_p != &local_f8.import_statement.field_2) {
          operator_delete(local_f8.import_statement._M_dataplus._M_p,
                          local_f8.import_statement.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.name._M_dataplus._M_p != &local_f8.name.field_2) {
          operator_delete(local_f8.name._M_dataplus._M_p,
                          CONCAT71(local_f8.name.field_2._M_allocated_capacity._1_7_,
                                   local_f8.name.field_2._M_local_buf[0]) + 1);
        }
      }
      if (allowNull) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,local_158,local_150 + (long)local_158);
        psVar4 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,local_158,local_150 + (long)local_158);
        psVar4 = extraout_RAX_00;
      }
      goto LAB_0024b793;
    case BASE_TYPE_ARRAY:
      goto switchD_0024b2a6_caseD_11;
    }
switchD_0024b2a6_default:
    if (BVar2 == BASE_TYPE_BOOL) {
      pcVar5 = "boolean";
      if (allowNull) {
        pcVar5 = "boolean|null";
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar7 = pcVar5 + (ulong)allowNull * 5 + 7;
      goto LAB_0024b3e9;
    }
switchD_0024b2a6_caseD_b:
    if (0xb < BVar2 - BASE_TYPE_UTYPE) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = "flatbuffers.Offset";
      pcVar7 = "";
      goto LAB_0024b3e9;
    }
    if (type->enum_def != (EnumDef *)0x0) {
      AddImport<flatbuffers::EnumDef>(&local_f8,this,imports,owner,type->enum_def);
      local_158 = &local_148;
      paVar1 = &local_f8.name.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.name._M_dataplus._M_p == paVar1) {
        local_148._8_8_ = local_f8.name.field_2._8_8_;
      }
      else {
        local_158 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f8.name._M_dataplus._M_p;
      }
      local_148._M_allocated_capacity._1_7_ = local_f8.name.field_2._M_allocated_capacity._1_7_;
      local_148._M_local_buf[0] = local_f8.name.field_2._M_local_buf[0];
      local_150 = local_f8.name._M_string_length;
      local_f8.name._M_string_length = 0;
      local_f8.name.field_2._M_local_buf[0] = '\0';
      local_f8.name._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.object_name._M_dataplus._M_p != &local_f8.object_name.field_2) {
        operator_delete(local_f8.object_name._M_dataplus._M_p,
                        local_f8.object_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.rel_file_path._M_dataplus._M_p != &local_f8.rel_file_path.field_2) {
        operator_delete(local_f8.rel_file_path._M_dataplus._M_p,
                        local_f8.rel_file_path.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.bare_file_path._M_dataplus._M_p != &local_f8.bare_file_path.field_2) {
        operator_delete(local_f8.bare_file_path._M_dataplus._M_p,
                        local_f8.bare_file_path.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.export_statement._M_dataplus._M_p != &local_f8.export_statement.field_2) {
        operator_delete(local_f8.export_statement._M_dataplus._M_p,
                        local_f8.export_statement.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.import_statement._M_dataplus._M_p != &local_f8.import_statement.field_2) {
        operator_delete(local_f8.import_statement._M_dataplus._M_p,
                        local_f8.import_statement.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.name._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8.name._M_dataplus._M_p,
                        CONCAT71(local_f8.name.field_2._M_allocated_capacity._1_7_,
                                 local_f8.name.field_2._M_local_buf[0]) + 1);
      }
      if (allowNull) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,local_158,local_150 + (long)local_158);
        psVar4 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,local_158,local_150 + (long)local_158);
        psVar4 = extraout_RAX_01;
      }
LAB_0024b793:
      uVar8 = local_148._M_allocated_capacity;
      _Var9._M_p = (pointer)local_158;
      if (local_158 == &local_148) {
        return psVar4;
      }
LAB_0024b7a1:
      operator_delete(_Var9._M_p,uVar8 + 1);
      return extraout_RAX_02;
    }
    pcVar7 = "number|null";
    pcVar5 = "number";
  }
  else {
    if (1 < BVar2 - BASE_TYPE_LONG) {
      if (BVar2 != BASE_TYPE_ARRAY) goto switchD_0024b2a6_default;
switchD_0024b2a6_caseD_11:
      paVar1 = &local_f8.name.field_2;
      local_f8.name._M_string_length = 0;
      local_f8.name.field_2._M_local_buf[0] = '\0';
      local_f8.name._M_dataplus._M_p = (pointer)paVar1;
      if (type->element - BASE_TYPE_LONG < 2) {
        pcVar5 = "bigint[]";
LAB_0024b5e5:
        std::__cxx11::string::_M_replace((ulong)&local_f8,0,(char *)0x0,(ulong)pcVar5);
      }
      else {
        if (type->element != BASE_TYPE_STRUCT) {
          pcVar5 = "number[]";
          goto LAB_0024b5e5;
        }
        std::__cxx11::string::_M_replace((ulong)&local_f8,0,(char *)0x0,0x36f00a);
        if ((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api == true) {
          (*(this->namer_).super_Namer._vptr_Namer[0x11])(&local_138,&this->namer_,type->struct_def)
          ;
          std::operator+(&local_118,"(any|",&local_138);
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_118);
          paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar3 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar3 == paVar6) {
            local_148._M_allocated_capacity = paVar6->_M_allocated_capacity;
            local_148._8_8_ = plVar3[3];
            local_158 = &local_148;
          }
          else {
            local_148._M_allocated_capacity = paVar6->_M_allocated_capacity;
            local_158 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar3;
          }
          local_150 = plVar3[1];
          *plVar3 = (long)paVar6;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_158);
          if (local_158 != &local_148) {
            operator_delete(local_158,local_148._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
        }
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,local_f8.name._M_dataplus._M_p,
                 local_f8.name._M_dataplus._M_p + local_f8.name._M_string_length);
      psVar4 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.name._M_dataplus._M_p == paVar1) {
        return psVar4;
      }
      uVar8 = CONCAT71(local_f8.name.field_2._M_allocated_capacity._1_7_,
                       local_f8.name.field_2._M_local_buf[0]);
      _Var9._M_p = local_f8.name._M_dataplus._M_p;
      goto LAB_0024b7a1;
    }
switchD_0024b2a6_caseD_9:
    pcVar7 = "bigint|null";
    pcVar5 = "bigint";
  }
  if (allowNull) {
    pcVar5 = pcVar7;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar7 = pcVar5 + (ulong)allowNull * 5 + 6;
LAB_0024b3e9:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar5,pcVar7);
  return extraout_RAX;
}

Assistant:

std::string GenTypeName(import_set &imports, const Definition &owner,
                          const Type &type, bool input,
                          bool allowNull = false) {
    if (!input) {
      if (IsString(type) || type.base_type == BASE_TYPE_STRUCT) {
        std::string name;
        if (IsString(type)) {
          name = "string|Uint8Array";
        } else {
          name = AddImport(imports, owner, *type.struct_def).name;
        }
        return allowNull ? (name + "|null") : name;
      }
    }

    switch (type.base_type) {
      case BASE_TYPE_BOOL: return allowNull ? "boolean|null" : "boolean";
      case BASE_TYPE_LONG:
      case BASE_TYPE_ULONG: return allowNull ? "bigint|null" : "bigint";
      case BASE_TYPE_ARRAY: {
        std::string name;
        if (type.element == BASE_TYPE_LONG || type.element == BASE_TYPE_ULONG) {
          name = "bigint[]";
        } else if (type.element != BASE_TYPE_STRUCT) {
          name = "number[]";
        } else {
          name = "any[]";
          if (parser_.opts.generate_object_based_api) {
            name = "(any|" +
                   GetTypeName(*type.struct_def, /*object_api =*/true) + ")[]";
          }
        }

        return name + (allowNull ? "|null" : "");
      }
      default:
        if (IsScalar(type.base_type)) {
          if (type.enum_def) {
            const auto enum_name =
                AddImport(imports, owner, *type.enum_def).name;
            return allowNull ? (enum_name + "|null") : enum_name;
          }
          return allowNull ? "number|null" : "number";
        }
        return "flatbuffers.Offset";
    }
  }